

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_h_predictor_64x16_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined8 uVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ushort uVar6;
  undefined8 *in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  undefined1 auVar11 [16];
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  __m128i y_select;
  int y_mask;
  __m128i round;
  __m128i scaled_top_right8;
  __m128i scaled_top_right7;
  __m128i scaled_top_right6;
  __m128i scaled_top_right5;
  __m128i inverted_weights8;
  __m128i inverted_weights7;
  __m128i inverted_weights6;
  __m128i inverted_weights5;
  __m128i weights8;
  __m128i weights7;
  __m128i weights6;
  __m128i weights5;
  __m128i weights_hihi;
  __m128i weights_hilo;
  __m128i scaled_top_right4;
  __m128i scaled_top_right3;
  __m128i scaled_top_right2;
  __m128i scaled_top_right1;
  __m128i inverted_weights4;
  __m128i inverted_weights3;
  __m128i inverted_weights2;
  __m128i inverted_weights1;
  __m128i weights4;
  __m128i weights3;
  __m128i weights2;
  __m128i weights1;
  __m128i scale;
  __m128i weights_lohi;
  __m128i weights_lolo;
  __m128i left1;
  __m128i top_right;
  __m128i pred2_7;
  __m128i pred1_7;
  __m128i pred_sum2_7;
  __m128i pred_sum1_7;
  __m128i weighted_px2_7;
  __m128i weighted_px1_7;
  __m128i pred2_6;
  __m128i pred1_6;
  __m128i pred_sum2_6;
  __m128i pred_sum1_6;
  __m128i weighted_px2_6;
  __m128i weighted_px1_6;
  __m128i pred2_5;
  __m128i pred1_5;
  __m128i pred_sum2_5;
  __m128i pred_sum1_5;
  __m128i weighted_px2_5;
  __m128i weighted_px1_5;
  __m128i pred2_4;
  __m128i pred1_4;
  __m128i pred_sum2_4;
  __m128i pred_sum1_4;
  __m128i weighted_px2_4;
  __m128i weighted_px1_4;
  __m128i pred2_3;
  __m128i pred1_3;
  __m128i pred_sum2_3;
  __m128i pred_sum1_3;
  __m128i weighted_px2_3;
  __m128i weighted_px1_3;
  __m128i pred2_2;
  __m128i pred1_2;
  __m128i pred_sum2_2;
  __m128i pred_sum1_2;
  __m128i weighted_px2_2;
  __m128i weighted_px1_2;
  __m128i pred2_1;
  __m128i pred1_1;
  __m128i pred_sum2_1;
  __m128i pred_sum1_1;
  __m128i weighted_px2_1;
  __m128i weighted_px1_1;
  __m128i pred2;
  __m128i pred1;
  __m128i pred_sum2;
  __m128i pred_sum1;
  __m128i weighted_px2;
  __m128i weighted_px1;
  int local_1a5c;
  int local_1a1c;
  undefined8 *local_17f8;
  byte local_1778;
  undefined1 uStack_1777;
  undefined1 uStack_1776;
  undefined1 uStack_1775;
  byte bStack_1774;
  undefined1 uStack_1773;
  undefined1 uStack_1772;
  undefined1 uStack_1771;
  byte local_1538;
  undefined1 uStack_1537;
  undefined1 uStack_1536;
  undefined1 uStack_1535;
  byte bStack_1534;
  undefined1 uStack_1533;
  undefined1 uStack_1532;
  undefined1 uStack_1531;
  ushort uStack_1422;
  ushort uStack_141a;
  ushort uStack_1402;
  ushort uStack_13fa;
  ushort uStack_13e2;
  ushort uStack_13da;
  ushort uStack_13c2;
  ushort uStack_13ba;
  ushort uStack_13a2;
  ushort uStack_139a;
  ushort uStack_1382;
  ushort uStack_137a;
  ushort uStack_1362;
  ushort uStack_135a;
  ushort uStack_1346;
  ushort uStack_1344;
  ushort uStack_1342;
  ushort uStack_133e;
  ushort uStack_133c;
  ushort uStack_133a;
  short local_bc8;
  short sStack_bc6;
  short sStack_bc4;
  short sStack_bc2;
  short sStack_bc0;
  short sStack_bbe;
  short sStack_bbc;
  short sStack_bba;
  short local_4c8;
  short sStack_4c6;
  short sStack_4c4;
  short sStack_4c2;
  short sStack_4c0;
  short sStack_4be;
  short sStack_4bc;
  short sStack_4ba;
  __m128i left_y_1;
  __m128i y_select_1;
  int y_mask_1;
  __m128i left2;
  __m128i left_y;
  
  bVar2 = *(byte *)(in_RDX + 0x3f);
  uVar6 = (ushort)bVar2;
  uVar1 = *in_RCX;
  local_1538 = (byte)uVar1;
  uStack_1537 = (undefined1)((ulong)uVar1 >> 8);
  uStack_1536 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_1535 = (undefined1)((ulong)uVar1 >> 0x18);
  bStack_1534 = (byte)((ulong)uVar1 >> 0x20);
  uStack_1533 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_1532 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_1531 = (undefined1)((ulong)uVar1 >> 0x38);
  uStack_1346 = (ushort)bVar2;
  uStack_1344 = (ushort)bVar2;
  uStack_1342 = (ushort)bVar2;
  uStack_133e = (ushort)bVar2;
  uStack_133c = (ushort)bVar2;
  uStack_133a = (ushort)bVar2;
  uStack_1362 = (ushort)bVar2;
  uStack_135a = (ushort)bVar2;
  uStack_1382 = (ushort)bVar2;
  uStack_137a = (ushort)bVar2;
  uStack_13a2 = (ushort)bVar2;
  uStack_139a = (ushort)bVar2;
  uStack_13c2 = (ushort)bVar2;
  uStack_13ba = (ushort)bVar2;
  uStack_13e2 = (ushort)bVar2;
  uStack_13da = (ushort)bVar2;
  uStack_1402 = (ushort)bVar2;
  uStack_13fa = (ushort)bVar2;
  uStack_1422 = (ushort)bVar2;
  uStack_141a = (ushort)bVar2;
  local_17f8 = in_RDI;
  for (local_1a1c = 0x1000100; local_1a1c < 0xf0e0f0f; local_1a1c = local_1a1c + 0x2020202) {
    auVar4._4_4_ = local_1a1c;
    auVar4._0_4_ = local_1a1c;
    auVar4._12_4_ = local_1a1c;
    auVar4._8_4_ = local_1a1c;
    auVar5[1] = 0;
    auVar5[0] = local_1538;
    auVar5[2] = uStack_1537;
    auVar5[3] = 0;
    auVar5[4] = uStack_1536;
    auVar5[5] = 0;
    auVar5[6] = uStack_1535;
    auVar5[7] = 0;
    auVar5[9] = 0;
    auVar5[8] = bStack_1534;
    auVar5[10] = uStack_1533;
    auVar5[0xb] = 0;
    auVar5[0xc] = uStack_1532;
    auVar5[0xd] = 0;
    auVar5[0xe] = uStack_1531;
    auVar5[0xf] = 0;
    auVar11 = pshufb(auVar5,auVar4);
    local_4c8 = auVar11._0_2_;
    sStack_4c6 = auVar11._2_2_;
    sStack_4c4 = auVar11._4_2_;
    sStack_4c2 = auVar11._6_2_;
    sStack_4c0 = auVar11._8_2_;
    sStack_4be = auVar11._10_2_;
    sStack_4bc = auVar11._12_2_;
    sStack_4ba = auVar11._14_2_;
    uVar7 = uVar6 + local_4c8 * 0xff + 0x80;
    uVar12 = uStack_1346 * 8 + sStack_4c6 * 0xf8 + 0x80;
    uVar16 = uStack_1344 * 0x10 + sStack_4c4 * 0xf0 + 0x80;
    uVar20 = uStack_1342 * 0x17 + sStack_4c2 * 0xe9 + 0x80;
    uVar24 = uVar6 * 0x1f + sStack_4c0 * 0xe1 + 0x80;
    uVar28 = uStack_133e * 0x26 + sStack_4be * 0xda + 0x80;
    uVar32 = uStack_133c * 0x2e + sStack_4bc * 0xd2 + 0x80;
    uVar36 = uStack_133a * 0x35 + sStack_4ba * 0xcb + 0x80;
    uVar8 = uVar7 >> 8;
    uVar13 = uVar12 >> 8;
    uVar17 = uVar16 >> 8;
    uVar21 = uVar20 >> 8;
    uVar25 = uVar24 >> 8;
    uVar29 = uVar28 >> 8;
    uVar33 = uVar32 >> 8;
    uVar37 = uVar36 >> 8;
    uVar9 = uVar6 * 0x3c + local_4c8 * 0xc4 + 0x80;
    uVar14 = uStack_1346 * 0x43 + sStack_4c6 * 0xbd + 0x80;
    uVar18 = uStack_1344 * 0x4a + sStack_4c4 * 0xb6 + 0x80;
    uVar22 = uStack_1362 * 0x50 + sStack_4c2 * 0xb0 + 0x80;
    uVar26 = uVar6 * 0x57 + sStack_4c0 * 0xa9 + 0x80;
    uVar30 = uStack_133e * 0x5d + sStack_4be * 0xa3 + 0x80;
    uVar34 = uStack_133c * 100 + sStack_4bc * 0x9c + 0x80;
    uVar38 = uStack_135a * 0x6a + sStack_4ba * 0x96 + 0x80;
    uVar10 = uVar9 >> 8;
    uVar15 = uVar14 >> 8;
    uVar19 = uVar18 >> 8;
    uVar23 = uVar22 >> 8;
    uVar27 = uVar26 >> 8;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar39 = uVar38 >> 8;
    *local_17f8 = CONCAT17((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37),
                           CONCAT16((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) -
                                    (0xff < uVar33),
                                    CONCAT15((uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar28 >> 8)
                                             - (0xff < uVar29),
                                             CONCAT14((uVar25 != 0) * (uVar25 < 0x100) *
                                                      (char)(uVar24 >> 8) - (0xff < uVar25),
                                                      CONCAT13((uVar21 != 0) * (uVar21 < 0x100) *
                                                               (char)(uVar20 >> 8) - (0xff < uVar21)
                                                               ,CONCAT12((uVar17 != 0) *
                                                                         (uVar17 < 0x100) *
                                                                         (char)(uVar16 >> 8) -
                                                                         (0xff < uVar17),
                                                                         CONCAT11((uVar13 != 0) *
                                                                                  (uVar13 < 0x100) *
                                                                                  (char)(uVar12 >> 8
                                                                                        ) - (0xff < 
                                                  uVar13),(uVar8 != 0) * (uVar8 < 0x100) *
                                                          (char)(uVar7 >> 8) - (0xff < uVar8))))))))
    ;
    local_17f8[1] =
         CONCAT17((uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39),
                  CONCAT16((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) - (0xff < uVar35),
                           CONCAT15((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) -
                                    (0xff < uVar31),
                                    CONCAT14((uVar27 != 0) * (uVar27 < 0x100) * (char)(uVar26 >> 8)
                                             - (0xff < uVar27),
                                             CONCAT13((uVar23 != 0) * (uVar23 < 0x100) *
                                                      (char)(uVar22 >> 8) - (0xff < uVar23),
                                                      CONCAT12((uVar19 != 0) * (uVar19 < 0x100) *
                                                               (char)(uVar18 >> 8) - (0xff < uVar19)
                                                               ,CONCAT11((uVar15 != 0) *
                                                                         (uVar15 < 0x100) *
                                                                         (char)(uVar14 >> 8) -
                                                                         (0xff < uVar15),
                                                                         (uVar10 != 0) *
                                                                         (uVar10 < 0x100) *
                                                                         (char)(uVar9 >> 8) -
                                                                         (0xff < uVar10))))))));
    uVar7 = uVar6 * 0x70 + local_4c8 * 0x90 + 0x80;
    uVar12 = uStack_1346 * 0x76 + sStack_4c6 * 0x8a + 0x80;
    uVar16 = uStack_1344 * 0x7b + sStack_4c4 * 0x85 + 0x80;
    uVar20 = uStack_1382 * 0x81 + sStack_4c2 * 0x7f + 0x80;
    uVar24 = uVar6 * 0x87 + sStack_4c0 * 0x79 + 0x80;
    uVar28 = uStack_133e * 0x8c + sStack_4be * 0x74 + 0x80;
    uVar32 = uStack_133c * 0x91 + sStack_4bc * 0x6f + 0x80;
    uVar36 = uStack_137a * 0x96 + sStack_4ba * 0x6a + 0x80;
    uVar8 = uVar7 >> 8;
    uVar13 = uVar12 >> 8;
    uVar17 = uVar16 >> 8;
    uVar21 = uVar20 >> 8;
    uVar25 = uVar24 >> 8;
    uVar29 = uVar28 >> 8;
    uVar33 = uVar32 >> 8;
    uVar37 = uVar36 >> 8;
    uVar9 = uVar6 * 0x9b + local_4c8 * 0x65 + 0x80;
    uVar14 = uStack_1346 * 0xa0 + sStack_4c6 * 0x60 + 0x80;
    uVar18 = uStack_1344 * 0xa5 + sStack_4c4 * 0x5b + 0x80;
    uVar22 = uStack_13a2 * 0xaa + sStack_4c2 * 0x56 + 0x80;
    uVar26 = uVar6 * 0xae + sStack_4c0 * 0x52 + 0x80;
    uVar30 = uStack_133e * 0xb3 + sStack_4be * 0x4d + 0x80;
    uVar34 = uStack_133c * 0xb7 + sStack_4bc * 0x49 + 0x80;
    uVar38 = uStack_139a * 0xbb + sStack_4ba * 0x45 + 0x80;
    uVar10 = uVar9 >> 8;
    uVar15 = uVar14 >> 8;
    uVar19 = uVar18 >> 8;
    uVar23 = uVar22 >> 8;
    uVar27 = uVar26 >> 8;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar39 = uVar38 >> 8;
    local_17f8[2] =
         CONCAT17((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37),
                  CONCAT16((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) - (0xff < uVar33),
                           CONCAT15((uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar28 >> 8) -
                                    (0xff < uVar29),
                                    CONCAT14((uVar25 != 0) * (uVar25 < 0x100) * (char)(uVar24 >> 8)
                                             - (0xff < uVar25),
                                             CONCAT13((uVar21 != 0) * (uVar21 < 0x100) *
                                                      (char)(uVar20 >> 8) - (0xff < uVar21),
                                                      CONCAT12((uVar17 != 0) * (uVar17 < 0x100) *
                                                               (char)(uVar16 >> 8) - (0xff < uVar17)
                                                               ,CONCAT11((uVar13 != 0) *
                                                                         (uVar13 < 0x100) *
                                                                         (char)(uVar12 >> 8) -
                                                                         (0xff < uVar13),
                                                                         (uVar8 != 0) *
                                                                         (uVar8 < 0x100) *
                                                                         (char)(uVar7 >> 8) -
                                                                         (0xff < uVar8))))))));
    local_17f8[3] =
         CONCAT17((uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39),
                  CONCAT16((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) - (0xff < uVar35),
                           CONCAT15((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) -
                                    (0xff < uVar31),
                                    CONCAT14((uVar27 != 0) * (uVar27 < 0x100) * (char)(uVar26 >> 8)
                                             - (0xff < uVar27),
                                             CONCAT13((uVar23 != 0) * (uVar23 < 0x100) *
                                                      (char)(uVar22 >> 8) - (0xff < uVar23),
                                                      CONCAT12((uVar19 != 0) * (uVar19 < 0x100) *
                                                               (char)(uVar18 >> 8) - (0xff < uVar19)
                                                               ,CONCAT11((uVar15 != 0) *
                                                                         (uVar15 < 0x100) *
                                                                         (char)(uVar14 >> 8) -
                                                                         (0xff < uVar15),
                                                                         (uVar10 != 0) *
                                                                         (uVar10 < 0x100) *
                                                                         (char)(uVar9 >> 8) -
                                                                         (0xff < uVar10))))))));
    uVar7 = uVar6 * 0xbf + local_4c8 * 0x41 + 0x80;
    uVar12 = uStack_1346 * 0xc3 + sStack_4c6 * 0x3d + 0x80;
    uVar16 = uStack_1344 * 199 + sStack_4c4 * 0x39 + 0x80;
    uVar20 = uStack_13c2 * 0xca + sStack_4c2 * 0x36 + 0x80;
    uVar24 = uVar6 * 0xce + sStack_4c0 * 0x32 + 0x80;
    uVar28 = uStack_133e * 0xd1 + sStack_4be * 0x2f + 0x80;
    uVar32 = uStack_133c * 0xd4 + sStack_4bc * 0x2c + 0x80;
    uVar36 = uStack_13ba * 0xd7 + sStack_4ba * 0x29 + 0x80;
    uVar8 = uVar7 >> 8;
    uVar13 = uVar12 >> 8;
    uVar17 = uVar16 >> 8;
    uVar21 = uVar20 >> 8;
    uVar25 = uVar24 >> 8;
    uVar29 = uVar28 >> 8;
    uVar33 = uVar32 >> 8;
    uVar37 = uVar36 >> 8;
    uVar9 = uVar6 * 0xda + local_4c8 * 0x26 + 0x80;
    uVar14 = uStack_1346 * 0xdd + sStack_4c6 * 0x23 + 0x80;
    uVar18 = uStack_1344 * 0xe0 + sStack_4c4 * 0x20 + 0x80;
    uVar22 = uStack_13e2 * 0xe3 + sStack_4c2 * 0x1d + 0x80;
    uVar26 = uVar6 * 0xe5 + sStack_4c0 * 0x1b + 0x80;
    uVar30 = uStack_133e * 0xe7 + sStack_4be * 0x19 + 0x80;
    uVar34 = uStack_133c * 0xea + sStack_4bc * 0x16 + 0x80;
    uVar38 = uStack_13da * 0xec + sStack_4ba * 0x14 + 0x80;
    uVar10 = uVar9 >> 8;
    uVar15 = uVar14 >> 8;
    uVar19 = uVar18 >> 8;
    uVar23 = uVar22 >> 8;
    uVar27 = uVar26 >> 8;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar39 = uVar38 >> 8;
    local_17f8[4] =
         CONCAT17((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37),
                  CONCAT16((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) - (0xff < uVar33),
                           CONCAT15((uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar28 >> 8) -
                                    (0xff < uVar29),
                                    CONCAT14((uVar25 != 0) * (uVar25 < 0x100) * (char)(uVar24 >> 8)
                                             - (0xff < uVar25),
                                             CONCAT13((uVar21 != 0) * (uVar21 < 0x100) *
                                                      (char)(uVar20 >> 8) - (0xff < uVar21),
                                                      CONCAT12((uVar17 != 0) * (uVar17 < 0x100) *
                                                               (char)(uVar16 >> 8) - (0xff < uVar17)
                                                               ,CONCAT11((uVar13 != 0) *
                                                                         (uVar13 < 0x100) *
                                                                         (char)(uVar12 >> 8) -
                                                                         (0xff < uVar13),
                                                                         (uVar8 != 0) *
                                                                         (uVar8 < 0x100) *
                                                                         (char)(uVar7 >> 8) -
                                                                         (0xff < uVar8))))))));
    local_17f8[5] =
         CONCAT17((uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39),
                  CONCAT16((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) - (0xff < uVar35),
                           CONCAT15((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) -
                                    (0xff < uVar31),
                                    CONCAT14((uVar27 != 0) * (uVar27 < 0x100) * (char)(uVar26 >> 8)
                                             - (0xff < uVar27),
                                             CONCAT13((uVar23 != 0) * (uVar23 < 0x100) *
                                                      (char)(uVar22 >> 8) - (0xff < uVar23),
                                                      CONCAT12((uVar19 != 0) * (uVar19 < 0x100) *
                                                               (char)(uVar18 >> 8) - (0xff < uVar19)
                                                               ,CONCAT11((uVar15 != 0) *
                                                                         (uVar15 < 0x100) *
                                                                         (char)(uVar14 >> 8) -
                                                                         (0xff < uVar15),
                                                                         (uVar10 != 0) *
                                                                         (uVar10 < 0x100) *
                                                                         (char)(uVar9 >> 8) -
                                                                         (0xff < uVar10))))))));
    uVar7 = uVar6 * 0xee + local_4c8 * 0x12 + 0x80;
    uVar12 = uStack_1346 * 0xf0 + sStack_4c6 * 0x10 + 0x80;
    uVar16 = uStack_1344 * 0xf1 + sStack_4c4 * 0xf + 0x80;
    uVar20 = uStack_1402 * 0xf3 + sStack_4c2 * 0xd + 0x80;
    uVar24 = uVar6 * 0xf4 + sStack_4c0 * 0xc + 0x80;
    uVar28 = uStack_133e * 0xf6 + sStack_4be * 10 + 0x80;
    uVar32 = uStack_133c * 0xf7 + sStack_4bc * 9 + 0x80;
    uVar36 = uStack_13fa * 0xf8 + sStack_4ba * 8 + 0x80;
    uVar8 = uVar7 >> 8;
    uVar13 = uVar12 >> 8;
    uVar17 = uVar16 >> 8;
    uVar21 = uVar20 >> 8;
    uVar25 = uVar24 >> 8;
    uVar29 = uVar28 >> 8;
    uVar33 = uVar32 >> 8;
    uVar37 = uVar36 >> 8;
    uVar9 = uVar6 * 0xf9 + local_4c8 * 7 + 0x80;
    uVar14 = uStack_1346 * 0xfa + sStack_4c6 * 6 + 0x80;
    uVar18 = uStack_1344 * 0xfa + sStack_4c4 * 6 + 0x80;
    uVar22 = uStack_1422 * 0xfb + sStack_4c2 * 5 + 0x80;
    uVar26 = uVar6 * 0xfb + sStack_4c0 * 5 + 0x80;
    uVar30 = uStack_133e * 0xfc + sStack_4be * 4 + 0x80;
    uVar34 = uStack_133c * 0xfc + sStack_4bc * 4 + 0x80;
    uVar38 = uStack_141a * 0xfc + sStack_4ba * 4 + 0x80;
    uVar10 = uVar9 >> 8;
    uVar15 = uVar14 >> 8;
    uVar19 = uVar18 >> 8;
    uVar23 = uVar22 >> 8;
    uVar27 = uVar26 >> 8;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar39 = uVar38 >> 8;
    local_17f8[6] =
         CONCAT17((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37),
                  CONCAT16((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) - (0xff < uVar33),
                           CONCAT15((uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar28 >> 8) -
                                    (0xff < uVar29),
                                    CONCAT14((uVar25 != 0) * (uVar25 < 0x100) * (char)(uVar24 >> 8)
                                             - (0xff < uVar25),
                                             CONCAT13((uVar21 != 0) * (uVar21 < 0x100) *
                                                      (char)(uVar20 >> 8) - (0xff < uVar21),
                                                      CONCAT12((uVar17 != 0) * (uVar17 < 0x100) *
                                                               (char)(uVar16 >> 8) - (0xff < uVar17)
                                                               ,CONCAT11((uVar13 != 0) *
                                                                         (uVar13 < 0x100) *
                                                                         (char)(uVar12 >> 8) -
                                                                         (0xff < uVar13),
                                                                         (uVar8 != 0) *
                                                                         (uVar8 < 0x100) *
                                                                         (char)(uVar7 >> 8) -
                                                                         (0xff < uVar8))))))));
    local_17f8[7] =
         CONCAT17((uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39),
                  CONCAT16((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) - (0xff < uVar35),
                           CONCAT15((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) -
                                    (0xff < uVar31),
                                    CONCAT14((uVar27 != 0) * (uVar27 < 0x100) * (char)(uVar26 >> 8)
                                             - (0xff < uVar27),
                                             CONCAT13((uVar23 != 0) * (uVar23 < 0x100) *
                                                      (char)(uVar22 >> 8) - (0xff < uVar23),
                                                      CONCAT12((uVar19 != 0) * (uVar19 < 0x100) *
                                                               (char)(uVar18 >> 8) - (0xff < uVar19)
                                                               ,CONCAT11((uVar15 != 0) *
                                                                         (uVar15 < 0x100) *
                                                                         (char)(uVar14 >> 8) -
                                                                         (0xff < uVar15),
                                                                         (uVar10 != 0) *
                                                                         (uVar10 < 0x100) *
                                                                         (char)(uVar9 >> 8) -
                                                                         (0xff < uVar10))))))));
    local_17f8 = (undefined8 *)(in_RSI + (long)local_17f8);
  }
  uVar1 = in_RCX[1];
  local_1778 = (byte)uVar1;
  uStack_1777 = (undefined1)((ulong)uVar1 >> 8);
  uStack_1776 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_1775 = (undefined1)((ulong)uVar1 >> 0x18);
  bStack_1774 = (byte)((ulong)uVar1 >> 0x20);
  uStack_1773 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_1772 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_1771 = (undefined1)((ulong)uVar1 >> 0x38);
  for (local_1a5c = 0x1000100; local_1a5c < 0xf0e0f0f; local_1a5c = local_1a5c + 0x2020202) {
    auVar11._4_4_ = local_1a5c;
    auVar11._0_4_ = local_1a5c;
    auVar11._12_4_ = local_1a5c;
    auVar11._8_4_ = local_1a5c;
    auVar3[1] = 0;
    auVar3[0] = local_1778;
    auVar3[2] = uStack_1777;
    auVar3[3] = 0;
    auVar3[4] = uStack_1776;
    auVar3[5] = 0;
    auVar3[6] = uStack_1775;
    auVar3[7] = 0;
    auVar3[9] = 0;
    auVar3[8] = bStack_1774;
    auVar3[10] = uStack_1773;
    auVar3[0xb] = 0;
    auVar3[0xc] = uStack_1772;
    auVar3[0xd] = 0;
    auVar3[0xe] = uStack_1771;
    auVar3[0xf] = 0;
    auVar11 = pshufb(auVar3,auVar11);
    local_bc8 = auVar11._0_2_;
    sStack_bc6 = auVar11._2_2_;
    sStack_bc4 = auVar11._4_2_;
    sStack_bc2 = auVar11._6_2_;
    sStack_bc0 = auVar11._8_2_;
    sStack_bbe = auVar11._10_2_;
    sStack_bbc = auVar11._12_2_;
    sStack_bba = auVar11._14_2_;
    uVar7 = uVar6 + local_bc8 * 0xff + 0x80;
    uVar12 = uStack_1346 * 8 + sStack_bc6 * 0xf8 + 0x80;
    uVar16 = uStack_1344 * 0x10 + sStack_bc4 * 0xf0 + 0x80;
    uVar20 = uStack_1342 * 0x17 + sStack_bc2 * 0xe9 + 0x80;
    uVar24 = uVar6 * 0x1f + sStack_bc0 * 0xe1 + 0x80;
    uVar28 = uStack_133e * 0x26 + sStack_bbe * 0xda + 0x80;
    uVar32 = uStack_133c * 0x2e + sStack_bbc * 0xd2 + 0x80;
    uVar36 = uStack_133a * 0x35 + sStack_bba * 0xcb + 0x80;
    uVar8 = uVar7 >> 8;
    uVar13 = uVar12 >> 8;
    uVar17 = uVar16 >> 8;
    uVar21 = uVar20 >> 8;
    uVar25 = uVar24 >> 8;
    uVar29 = uVar28 >> 8;
    uVar33 = uVar32 >> 8;
    uVar37 = uVar36 >> 8;
    uVar9 = uVar6 * 0x3c + local_bc8 * 0xc4 + 0x80;
    uVar14 = uStack_1346 * 0x43 + sStack_bc6 * 0xbd + 0x80;
    uVar18 = uStack_1344 * 0x4a + sStack_bc4 * 0xb6 + 0x80;
    uVar22 = uStack_1362 * 0x50 + sStack_bc2 * 0xb0 + 0x80;
    uVar26 = uVar6 * 0x57 + sStack_bc0 * 0xa9 + 0x80;
    uVar30 = uStack_133e * 0x5d + sStack_bbe * 0xa3 + 0x80;
    uVar34 = uStack_133c * 100 + sStack_bbc * 0x9c + 0x80;
    uVar38 = uStack_135a * 0x6a + sStack_bba * 0x96 + 0x80;
    uVar10 = uVar9 >> 8;
    uVar15 = uVar14 >> 8;
    uVar19 = uVar18 >> 8;
    uVar23 = uVar22 >> 8;
    uVar27 = uVar26 >> 8;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar39 = uVar38 >> 8;
    *local_17f8 = CONCAT17((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37),
                           CONCAT16((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) -
                                    (0xff < uVar33),
                                    CONCAT15((uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar28 >> 8)
                                             - (0xff < uVar29),
                                             CONCAT14((uVar25 != 0) * (uVar25 < 0x100) *
                                                      (char)(uVar24 >> 8) - (0xff < uVar25),
                                                      CONCAT13((uVar21 != 0) * (uVar21 < 0x100) *
                                                               (char)(uVar20 >> 8) - (0xff < uVar21)
                                                               ,CONCAT12((uVar17 != 0) *
                                                                         (uVar17 < 0x100) *
                                                                         (char)(uVar16 >> 8) -
                                                                         (0xff < uVar17),
                                                                         CONCAT11((uVar13 != 0) *
                                                                                  (uVar13 < 0x100) *
                                                                                  (char)(uVar12 >> 8
                                                                                        ) - (0xff < 
                                                  uVar13),(uVar8 != 0) * (uVar8 < 0x100) *
                                                          (char)(uVar7 >> 8) - (0xff < uVar8))))))))
    ;
    local_17f8[1] =
         CONCAT17((uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39),
                  CONCAT16((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) - (0xff < uVar35),
                           CONCAT15((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) -
                                    (0xff < uVar31),
                                    CONCAT14((uVar27 != 0) * (uVar27 < 0x100) * (char)(uVar26 >> 8)
                                             - (0xff < uVar27),
                                             CONCAT13((uVar23 != 0) * (uVar23 < 0x100) *
                                                      (char)(uVar22 >> 8) - (0xff < uVar23),
                                                      CONCAT12((uVar19 != 0) * (uVar19 < 0x100) *
                                                               (char)(uVar18 >> 8) - (0xff < uVar19)
                                                               ,CONCAT11((uVar15 != 0) *
                                                                         (uVar15 < 0x100) *
                                                                         (char)(uVar14 >> 8) -
                                                                         (0xff < uVar15),
                                                                         (uVar10 != 0) *
                                                                         (uVar10 < 0x100) *
                                                                         (char)(uVar9 >> 8) -
                                                                         (0xff < uVar10))))))));
    uVar7 = uVar6 * 0x70 + local_bc8 * 0x90 + 0x80;
    uVar12 = uStack_1346 * 0x76 + sStack_bc6 * 0x8a + 0x80;
    uVar16 = uStack_1344 * 0x7b + sStack_bc4 * 0x85 + 0x80;
    uVar20 = uStack_1382 * 0x81 + sStack_bc2 * 0x7f + 0x80;
    uVar24 = uVar6 * 0x87 + sStack_bc0 * 0x79 + 0x80;
    uVar28 = uStack_133e * 0x8c + sStack_bbe * 0x74 + 0x80;
    uVar32 = uStack_133c * 0x91 + sStack_bbc * 0x6f + 0x80;
    uVar36 = uStack_137a * 0x96 + sStack_bba * 0x6a + 0x80;
    uVar8 = uVar7 >> 8;
    uVar13 = uVar12 >> 8;
    uVar17 = uVar16 >> 8;
    uVar21 = uVar20 >> 8;
    uVar25 = uVar24 >> 8;
    uVar29 = uVar28 >> 8;
    uVar33 = uVar32 >> 8;
    uVar37 = uVar36 >> 8;
    uVar9 = uVar6 * 0x9b + local_bc8 * 0x65 + 0x80;
    uVar14 = uStack_1346 * 0xa0 + sStack_bc6 * 0x60 + 0x80;
    uVar18 = uStack_1344 * 0xa5 + sStack_bc4 * 0x5b + 0x80;
    uVar22 = uStack_13a2 * 0xaa + sStack_bc2 * 0x56 + 0x80;
    uVar26 = uVar6 * 0xae + sStack_bc0 * 0x52 + 0x80;
    uVar30 = uStack_133e * 0xb3 + sStack_bbe * 0x4d + 0x80;
    uVar34 = uStack_133c * 0xb7 + sStack_bbc * 0x49 + 0x80;
    uVar38 = uStack_139a * 0xbb + sStack_bba * 0x45 + 0x80;
    uVar10 = uVar9 >> 8;
    uVar15 = uVar14 >> 8;
    uVar19 = uVar18 >> 8;
    uVar23 = uVar22 >> 8;
    uVar27 = uVar26 >> 8;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar39 = uVar38 >> 8;
    local_17f8[2] =
         CONCAT17((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37),
                  CONCAT16((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) - (0xff < uVar33),
                           CONCAT15((uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar28 >> 8) -
                                    (0xff < uVar29),
                                    CONCAT14((uVar25 != 0) * (uVar25 < 0x100) * (char)(uVar24 >> 8)
                                             - (0xff < uVar25),
                                             CONCAT13((uVar21 != 0) * (uVar21 < 0x100) *
                                                      (char)(uVar20 >> 8) - (0xff < uVar21),
                                                      CONCAT12((uVar17 != 0) * (uVar17 < 0x100) *
                                                               (char)(uVar16 >> 8) - (0xff < uVar17)
                                                               ,CONCAT11((uVar13 != 0) *
                                                                         (uVar13 < 0x100) *
                                                                         (char)(uVar12 >> 8) -
                                                                         (0xff < uVar13),
                                                                         (uVar8 != 0) *
                                                                         (uVar8 < 0x100) *
                                                                         (char)(uVar7 >> 8) -
                                                                         (0xff < uVar8))))))));
    local_17f8[3] =
         CONCAT17((uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39),
                  CONCAT16((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) - (0xff < uVar35),
                           CONCAT15((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) -
                                    (0xff < uVar31),
                                    CONCAT14((uVar27 != 0) * (uVar27 < 0x100) * (char)(uVar26 >> 8)
                                             - (0xff < uVar27),
                                             CONCAT13((uVar23 != 0) * (uVar23 < 0x100) *
                                                      (char)(uVar22 >> 8) - (0xff < uVar23),
                                                      CONCAT12((uVar19 != 0) * (uVar19 < 0x100) *
                                                               (char)(uVar18 >> 8) - (0xff < uVar19)
                                                               ,CONCAT11((uVar15 != 0) *
                                                                         (uVar15 < 0x100) *
                                                                         (char)(uVar14 >> 8) -
                                                                         (0xff < uVar15),
                                                                         (uVar10 != 0) *
                                                                         (uVar10 < 0x100) *
                                                                         (char)(uVar9 >> 8) -
                                                                         (0xff < uVar10))))))));
    uVar7 = uVar6 * 0xbf + local_bc8 * 0x41 + 0x80;
    uVar12 = uStack_1346 * 0xc3 + sStack_bc6 * 0x3d + 0x80;
    uVar16 = uStack_1344 * 199 + sStack_bc4 * 0x39 + 0x80;
    uVar20 = uStack_13c2 * 0xca + sStack_bc2 * 0x36 + 0x80;
    uVar24 = uVar6 * 0xce + sStack_bc0 * 0x32 + 0x80;
    uVar28 = uStack_133e * 0xd1 + sStack_bbe * 0x2f + 0x80;
    uVar32 = uStack_133c * 0xd4 + sStack_bbc * 0x2c + 0x80;
    uVar36 = uStack_13ba * 0xd7 + sStack_bba * 0x29 + 0x80;
    uVar8 = uVar7 >> 8;
    uVar13 = uVar12 >> 8;
    uVar17 = uVar16 >> 8;
    uVar21 = uVar20 >> 8;
    uVar25 = uVar24 >> 8;
    uVar29 = uVar28 >> 8;
    uVar33 = uVar32 >> 8;
    uVar37 = uVar36 >> 8;
    uVar9 = uVar6 * 0xda + local_bc8 * 0x26 + 0x80;
    uVar14 = uStack_1346 * 0xdd + sStack_bc6 * 0x23 + 0x80;
    uVar18 = uStack_1344 * 0xe0 + sStack_bc4 * 0x20 + 0x80;
    uVar22 = uStack_13e2 * 0xe3 + sStack_bc2 * 0x1d + 0x80;
    uVar26 = uVar6 * 0xe5 + sStack_bc0 * 0x1b + 0x80;
    uVar30 = uStack_133e * 0xe7 + sStack_bbe * 0x19 + 0x80;
    uVar34 = uStack_133c * 0xea + sStack_bbc * 0x16 + 0x80;
    uVar38 = uStack_13da * 0xec + sStack_bba * 0x14 + 0x80;
    uVar10 = uVar9 >> 8;
    uVar15 = uVar14 >> 8;
    uVar19 = uVar18 >> 8;
    uVar23 = uVar22 >> 8;
    uVar27 = uVar26 >> 8;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar39 = uVar38 >> 8;
    local_17f8[4] =
         CONCAT17((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37),
                  CONCAT16((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) - (0xff < uVar33),
                           CONCAT15((uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar28 >> 8) -
                                    (0xff < uVar29),
                                    CONCAT14((uVar25 != 0) * (uVar25 < 0x100) * (char)(uVar24 >> 8)
                                             - (0xff < uVar25),
                                             CONCAT13((uVar21 != 0) * (uVar21 < 0x100) *
                                                      (char)(uVar20 >> 8) - (0xff < uVar21),
                                                      CONCAT12((uVar17 != 0) * (uVar17 < 0x100) *
                                                               (char)(uVar16 >> 8) - (0xff < uVar17)
                                                               ,CONCAT11((uVar13 != 0) *
                                                                         (uVar13 < 0x100) *
                                                                         (char)(uVar12 >> 8) -
                                                                         (0xff < uVar13),
                                                                         (uVar8 != 0) *
                                                                         (uVar8 < 0x100) *
                                                                         (char)(uVar7 >> 8) -
                                                                         (0xff < uVar8))))))));
    local_17f8[5] =
         CONCAT17((uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39),
                  CONCAT16((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) - (0xff < uVar35),
                           CONCAT15((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) -
                                    (0xff < uVar31),
                                    CONCAT14((uVar27 != 0) * (uVar27 < 0x100) * (char)(uVar26 >> 8)
                                             - (0xff < uVar27),
                                             CONCAT13((uVar23 != 0) * (uVar23 < 0x100) *
                                                      (char)(uVar22 >> 8) - (0xff < uVar23),
                                                      CONCAT12((uVar19 != 0) * (uVar19 < 0x100) *
                                                               (char)(uVar18 >> 8) - (0xff < uVar19)
                                                               ,CONCAT11((uVar15 != 0) *
                                                                         (uVar15 < 0x100) *
                                                                         (char)(uVar14 >> 8) -
                                                                         (0xff < uVar15),
                                                                         (uVar10 != 0) *
                                                                         (uVar10 < 0x100) *
                                                                         (char)(uVar9 >> 8) -
                                                                         (0xff < uVar10))))))));
    uVar7 = uVar6 * 0xee + local_bc8 * 0x12 + 0x80;
    uVar12 = uStack_1346 * 0xf0 + sStack_bc6 * 0x10 + 0x80;
    uVar16 = uStack_1344 * 0xf1 + sStack_bc4 * 0xf + 0x80;
    uVar20 = uStack_1402 * 0xf3 + sStack_bc2 * 0xd + 0x80;
    uVar24 = uVar6 * 0xf4 + sStack_bc0 * 0xc + 0x80;
    uVar28 = uStack_133e * 0xf6 + sStack_bbe * 10 + 0x80;
    uVar32 = uStack_133c * 0xf7 + sStack_bbc * 9 + 0x80;
    uVar36 = uStack_13fa * 0xf8 + sStack_bba * 8 + 0x80;
    uVar8 = uVar7 >> 8;
    uVar13 = uVar12 >> 8;
    uVar17 = uVar16 >> 8;
    uVar21 = uVar20 >> 8;
    uVar25 = uVar24 >> 8;
    uVar29 = uVar28 >> 8;
    uVar33 = uVar32 >> 8;
    uVar37 = uVar36 >> 8;
    uVar9 = uVar6 * 0xf9 + local_bc8 * 7 + 0x80;
    uVar14 = uStack_1346 * 0xfa + sStack_bc6 * 6 + 0x80;
    uVar18 = uStack_1344 * 0xfa + sStack_bc4 * 6 + 0x80;
    uVar22 = uStack_1422 * 0xfb + sStack_bc2 * 5 + 0x80;
    uVar26 = uVar6 * 0xfb + sStack_bc0 * 5 + 0x80;
    uVar30 = uStack_133e * 0xfc + sStack_bbe * 4 + 0x80;
    uVar34 = uStack_133c * 0xfc + sStack_bbc * 4 + 0x80;
    uVar38 = uStack_141a * 0xfc + sStack_bba * 4 + 0x80;
    uVar10 = uVar9 >> 8;
    uVar15 = uVar14 >> 8;
    uVar19 = uVar18 >> 8;
    uVar23 = uVar22 >> 8;
    uVar27 = uVar26 >> 8;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar39 = uVar38 >> 8;
    local_17f8[6] =
         CONCAT17((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37),
                  CONCAT16((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) - (0xff < uVar33),
                           CONCAT15((uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar28 >> 8) -
                                    (0xff < uVar29),
                                    CONCAT14((uVar25 != 0) * (uVar25 < 0x100) * (char)(uVar24 >> 8)
                                             - (0xff < uVar25),
                                             CONCAT13((uVar21 != 0) * (uVar21 < 0x100) *
                                                      (char)(uVar20 >> 8) - (0xff < uVar21),
                                                      CONCAT12((uVar17 != 0) * (uVar17 < 0x100) *
                                                               (char)(uVar16 >> 8) - (0xff < uVar17)
                                                               ,CONCAT11((uVar13 != 0) *
                                                                         (uVar13 < 0x100) *
                                                                         (char)(uVar12 >> 8) -
                                                                         (0xff < uVar13),
                                                                         (uVar8 != 0) *
                                                                         (uVar8 < 0x100) *
                                                                         (char)(uVar7 >> 8) -
                                                                         (0xff < uVar8))))))));
    local_17f8[7] =
         CONCAT17((uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39),
                  CONCAT16((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) - (0xff < uVar35),
                           CONCAT15((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) -
                                    (0xff < uVar31),
                                    CONCAT14((uVar27 != 0) * (uVar27 < 0x100) * (char)(uVar26 >> 8)
                                             - (0xff < uVar27),
                                             CONCAT13((uVar23 != 0) * (uVar23 < 0x100) *
                                                      (char)(uVar22 >> 8) - (0xff < uVar23),
                                                      CONCAT12((uVar19 != 0) * (uVar19 < 0x100) *
                                                               (char)(uVar18 >> 8) - (0xff < uVar19)
                                                               ,CONCAT11((uVar15 != 0) *
                                                                         (uVar15 < 0x100) *
                                                                         (char)(uVar14 >> 8) -
                                                                         (0xff < uVar15),
                                                                         (uVar10 != 0) *
                                                                         (uVar10 < 0x100) *
                                                                         (char)(uVar9 >> 8) -
                                                                         (0xff < uVar10))))))));
    local_17f8 = (undefined8 *)(in_RSI + (long)local_17f8);
  }
  return;
}

Assistant:

void aom_smooth_h_predictor_64x16_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[63]);
  const __m128i left1 = cvtepu8_epi16(LoadLo8(left_column));
  const __m128i weights_lolo = LoadUnaligned16(smooth_weights + 60);
  const __m128i weights_lohi = LoadUnaligned16(smooth_weights + 76);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i weights1 = cvtepu8_epi16(weights_lolo);
  const __m128i weights2 = cvtepu8_epi16(_mm_srli_si128(weights_lolo, 8));
  const __m128i weights3 = cvtepu8_epi16(weights_lohi);
  const __m128i weights4 = cvtepu8_epi16(_mm_srli_si128(weights_lohi, 8));
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i inverted_weights3 = _mm_sub_epi16(scale, weights3);
  const __m128i inverted_weights4 = _mm_sub_epi16(scale, weights4);
  const __m128i scaled_top_right1 =
      _mm_mullo_epi16(inverted_weights1, top_right);
  const __m128i scaled_top_right2 =
      _mm_mullo_epi16(inverted_weights2, top_right);
  const __m128i scaled_top_right3 =
      _mm_mullo_epi16(inverted_weights3, top_right);
  const __m128i scaled_top_right4 =
      _mm_mullo_epi16(inverted_weights4, top_right);
  const __m128i weights_hilo = LoadUnaligned16(smooth_weights + 92);
  const __m128i weights_hihi = LoadUnaligned16(smooth_weights + 108);
  const __m128i weights5 = cvtepu8_epi16(weights_hilo);
  const __m128i weights6 = cvtepu8_epi16(_mm_srli_si128(weights_hilo, 8));
  const __m128i weights7 = cvtepu8_epi16(weights_hihi);
  const __m128i weights8 = cvtepu8_epi16(_mm_srli_si128(weights_hihi, 8));
  const __m128i inverted_weights5 = _mm_sub_epi16(scale, weights5);
  const __m128i inverted_weights6 = _mm_sub_epi16(scale, weights6);
  const __m128i inverted_weights7 = _mm_sub_epi16(scale, weights7);
  const __m128i inverted_weights8 = _mm_sub_epi16(scale, weights8);
  const __m128i scaled_top_right5 =
      _mm_mullo_epi16(inverted_weights5, top_right);
  const __m128i scaled_top_right6 =
      _mm_mullo_epi16(inverted_weights6, top_right);
  const __m128i scaled_top_right7 =
      _mm_mullo_epi16(inverted_weights7, top_right);
  const __m128i scaled_top_right8 =
      _mm_mullo_epi16(inverted_weights8, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    __m128i y_select = _mm_set1_epi32(y_mask);
    __m128i left_y = _mm_shuffle_epi8(left1, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3, weights4,
                                   scaled_top_right3, scaled_top_right4, round);
    write_smooth_directional_sum16(dst + 32, left_y, left_y, weights5, weights6,
                                   scaled_top_right5, scaled_top_right6, round);
    write_smooth_directional_sum16(dst + 48, left_y, left_y, weights7, weights8,
                                   scaled_top_right7, scaled_top_right8, round);
    dst += stride;
  }
  const __m128i left2 = cvtepu8_epi16(LoadLo8(left_column + 8));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    __m128i y_select = _mm_set1_epi32(y_mask);
    __m128i left_y = _mm_shuffle_epi8(left2, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3, weights4,
                                   scaled_top_right3, scaled_top_right4, round);
    write_smooth_directional_sum16(dst + 32, left_y, left_y, weights5, weights6,
                                   scaled_top_right5, scaled_top_right6, round);
    write_smooth_directional_sum16(dst + 48, left_y, left_y, weights7, weights8,
                                   scaled_top_right7, scaled_top_right8, round);
    dst += stride;
  }
}